

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Activate_Size(FT_Size size)

{
  FT_Face pFVar1;
  FT_Face face;
  FT_Size size_local;
  
  if (size == (FT_Size)0x0) {
    size_local._4_4_ = 0x24;
  }
  else {
    pFVar1 = size->face;
    if ((pFVar1 == (FT_Face)0x0) || (pFVar1->driver == (FT_Driver)0x0)) {
      size_local._4_4_ = 0x23;
    }
    else {
      pFVar1->size = size;
      size_local._4_4_ = 0;
    }
  }
  return size_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Activate_Size( FT_Size  size )
  {
    FT_Face  face;


    if ( !size )
      return FT_THROW( Invalid_Size_Handle );

    face = size->face;
    if ( !face || !face->driver )
      return FT_THROW( Invalid_Face_Handle );

    /* we don't need anything more complex than that; all size objects */
    /* are already listed by the face                                  */
    face->size = size;

    return FT_Err_Ok;
  }